

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O0

void __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
::initiate_async_wait::operator()
          (initiate_async_wait *this,
          _Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
          *handler)

{
  _Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
  *in_RSI;
  undefined8 *in_RDI;
  any_io_executor *in_stack_00000018;
  non_const_lvalue<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>_>
  handler2;
  non_const_lvalue<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>_>
  local_18 [3];
  
  detail::
  non_const_lvalue<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>_>
  ::non_const_lvalue(local_18,in_RSI);
  detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_service((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                 *)*in_RDI);
  detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_implementation
            ((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
              *)*in_RDI);
  detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::get_executor((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                  *)*in_RDI);
  detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
  ::
  async_wait<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,asio::any_io_executor>
            ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)this,(implementation_type *)handler,handler2.value,in_stack_00000018);
  return;
}

Assistant:

void operator()(ASIO_MOVE_ARG(WaitHandler) handler) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a WaitHandler.
      ASIO_WAIT_HANDLER_CHECK(WaitHandler, handler) type_check;

      detail::non_const_lvalue<WaitHandler> handler2(handler);
      self_->impl_.get_service().async_wait(
          self_->impl_.get_implementation(),
          handler2.value, self_->impl_.get_executor());
    }